

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderTextureImageSamplesTestBase::deinit(ShaderTextureImageSamplesTestBase *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  ShaderTextureImageSamplesTestBase *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  deinitProgramAndShaderObjects(this);
  if (this->m_bo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  if (this->m_internalformat_n_samples_data != (GLint *)0x0) {
    if (this->m_internalformat_n_samples_data != (GLint *)0x0) {
      operator_delete__(this->m_internalformat_n_samples_data);
    }
    this->m_internalformat_n_samples_data = (GLint *)0x0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_id);
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"glDeleteTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0xbb);
    this->m_to_id = 0;
  }
  return;
}

Assistant:

void ShaderTextureImageSamplesTestBase::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	deinitProgramAndShaderObjects();

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_internalformat_n_samples_data != DE_NULL)
	{
		delete[] m_internalformat_n_samples_data;

		m_internalformat_n_samples_data = DE_NULL;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");

		m_to_id = 0;
	}
}